

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

LoopLabels * push_ir_loop(Context_conflict *ctx,int isswitch)

{
  int iVar1;
  LoopLabels *pLVar2;
  int local_24;
  LoopLabels *retval;
  int isswitch_local;
  Context_conflict *ctx_local;
  
  pLVar2 = (LoopLabels *)Malloc(ctx,0x10);
  if (pLVar2 != (LoopLabels *)0x0) {
    if (isswitch == 0) {
      local_24 = generate_ir_label(ctx);
    }
    else {
      local_24 = -1;
    }
    pLVar2->start = local_24;
    iVar1 = generate_ir_label(ctx);
    pLVar2->end = iVar1;
    pLVar2->prev = ctx->ir_loop;
    ctx->ir_loop = pLVar2;
  }
  return pLVar2;
}

Assistant:

static const LoopLabels *push_ir_loop(Context *ctx, const int isswitch)
{
    // !!! FIXME: cache these allocations?
    LoopLabels *retval = Malloc(ctx, sizeof (LoopLabels));
    if (retval)
    {
        retval->start = (isswitch) ? -1 : generate_ir_label(ctx);
        retval->end = generate_ir_label(ctx);
        retval->prev = ctx->ir_loop;
        ctx->ir_loop = retval;
    } // if

    return retval;
}